

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O2

void __thiscall
Salsa20Cipher::processBytes(Salsa20Cipher *this,uint8_t *in,uint8_t *out,size_t byteCount)

{
  ulong uVar1;
  long lVar2;
  uint8_t keyStream [64];
  
  for (; byteCount != 0; byteCount = byteCount - uVar1) {
    generateKeyStream(this,keyStream);
    uVar1 = 0x40;
    if (byteCount < 0x40) {
      uVar1 = byteCount;
    }
    for (lVar2 = 0; (uint)lVar2 < (uint)uVar1; lVar2 = lVar2 + 1) {
      out[lVar2] = in[lVar2] ^ keyStream[lVar2];
    }
    out = out + lVar2;
    in = in + lVar2;
  }
  return;
}

Assistant:

void processBytes(const uint8_t* in, uint8_t* out, size_t byteCount)
	{
		uint8_t keyStream[BLOCK_SIZE];

		while (byteCount != 0) {
			generateKeyStream(keyStream);

			const auto count = byteCount < BLOCK_SIZE ? byteCount : BLOCK_SIZE;
			for (auto i = 0u; i < count; ++i, --byteCount)
				*out++ = keyStream[i] ^ *in++;
		}
	}